

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O2

REF_STATUS ref_dict_inspect(REF_DICT ref_dict)

{
  ulong uVar1;
  
  printf("ref_dict = %p\n",ref_dict);
  printf(" n = %d, max = %d\n",(ulong)(uint)ref_dict->n,(ulong)(uint)ref_dict->max);
  for (uVar1 = 0; (long)uVar1 < (long)ref_dict->n; uVar1 = uVar1 + 1) {
    printf(" %d [%d] = %d\n",(ulong)(uint)ref_dict->key[uVar1],uVar1 & 0xffffffff,
           (ulong)(uint)ref_dict->value[uVar1]);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_dict_inspect(REF_DICT ref_dict) {
  REF_INT i;

  printf("ref_dict = %p\n", (void *)ref_dict);
  printf(" n = %d, max = %d\n", ref_dict_n(ref_dict), ref_dict_max(ref_dict));

  each_ref_dict_key_index(ref_dict, i) {
    printf(" %d [%d] = %d\n", ref_dict->key[i], i, ref_dict->value[i]);
  }

  return REF_SUCCESS;
}